

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

CharFormat testing::internal::PrintAsStringLiteralTo(char32_t c,ostream *os)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char local_19;
  
  if (c < L'\"') {
    switch(c) {
    case L'\0':
      pcVar4 = "\\0";
      break;
    default:
      goto switchD_0018089c_caseD_1;
    case L'\a':
      pcVar4 = "\\a";
      break;
    case L'\b':
      pcVar4 = "\\b";
      break;
    case L'\t':
      pcVar4 = "\\t";
      break;
    case L'\n':
      pcVar4 = "\\n";
      break;
    case L'\v':
      pcVar4 = "\\v";
      break;
    case L'\f':
      pcVar4 = "\\f";
      break;
    case L'\r':
      pcVar4 = "\\r";
    }
LAB_00180911:
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,2);
    return kSpecialEscape;
  }
  if (c == L'\"') {
    pcVar4 = "\\\"";
    goto LAB_00180911;
  }
  if (c == L'\\') {
    pcVar4 = "\\\\";
    goto LAB_00180911;
  }
  if (c == L'\'') {
    pcVar4 = "\'";
    goto LAB_0018093d;
  }
switchD_0018089c_caseD_1:
  if (0x5e < (uint)(c + L'\xffffffe0')) {
    uVar1 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\x",2);
    lVar2 = *(long *)os;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(os + lVar3 + 0x18) = *(uint *)(os + lVar3 + 0x18) & 0xffffffb5 | 8;
    *(uint *)(os + *(long *)(lVar2 + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
    std::ostream::operator<<((ostream *)os,c);
    *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1;
    return kHexEscape;
  }
  pcVar4 = &local_19;
  local_19 = (char)c;
LAB_0018093d:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,1);
  return kAsIs;
}

Assistant:

static CharFormat PrintAsStringLiteralTo(char32_t c, ostream* os) {
  switch (c) {
    case L'\'':
      *os << "'";
      return kAsIs;
    case L'"':
      *os << "\\\"";
      return kSpecialEscape;
    default:
      return PrintAsCharLiteralTo(c, os);
  }
}